

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestSubdirCommand::InitialPass
          (cmCTestSubdirCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  char *__rhs;
  pointer in_name;
  int iVar4;
  bool bVar5;
  cmWorkingDirectory workdir;
  string fname;
  string cwd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&workdir,"called with incorrect number of arguments",
               (allocator<char> *)&cwd);
    cmCommand::SetError(&this->super_cmCommand,&workdir.OldDir);
    std::__cxx11::string::~string((string *)&workdir);
    bVar5 = false;
  }
  else {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&cwd,(SystemTools *)0x1,SUB81(param_2,0));
    in_name = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      bVar5 = in_name == pbVar1;
      if (bVar5) break;
      fname._M_string_length = 0;
      fname.field_2._M_local_buf[0] = '\0';
      fname._M_dataplus._M_p = (pointer)&fname.field_2;
      bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)&fname);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&fname);
        std::__cxx11::string::append((char *)&fname);
        std::__cxx11::string::append((string *)&fname);
      }
      bVar2 = cmsys::SystemTools::FileIsDirectory(&fname);
      if (bVar2) {
        cmWorkingDirectory::cmWorkingDirectory(&workdir,&fname);
        if (workdir.ResultCode == 0) {
          bVar2 = cmsys::SystemTools::FileExists("CTestTestfile.cmake");
          if (!bVar2) {
            bVar2 = cmsys::SystemTools::FileExists("DartTestfile.txt");
            if (!bVar2) {
              iVar4 = 3;
              goto LAB_00184620;
            }
          }
          std::__cxx11::string::append((char *)&fname);
          std::__cxx11::string::append((char *)&fname);
          bVar3 = cmMakefile::ReadDependentFile((this->super_cmCommand).Makefile,&fname,true);
          bVar2 = false;
          iVar4 = 0;
        }
        else {
          std::operator+(&local_70,"Failed to change directory to ",&fname);
          std::operator+(&local_50,&local_70," : ");
          __rhs = strerror(workdir.ResultCode);
          std::operator+(&local_90,&local_50,__rhs);
          cmCommand::SetError(&this->super_cmCommand,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          iVar4 = 1;
LAB_00184620:
          bVar3 = false;
          bVar2 = true;
        }
        cmWorkingDirectory::~cmWorkingDirectory(&workdir);
        if ((!bVar2) && (bVar3 == false)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&workdir,"Could not find include file: ",(allocator<char> *)&local_90
                    );
          std::__cxx11::string::append((string *)&workdir);
          cmCommand::SetError(&this->super_cmCommand,&workdir.OldDir);
          std::__cxx11::string::~string((string *)&workdir);
          std::__cxx11::string::~string((string *)&fname);
          break;
        }
        if (!bVar2) {
          iVar4 = 0;
        }
        std::__cxx11::string::~string((string *)&fname);
        if ((iVar4 != 3) && (iVar4 != 0)) break;
      }
      else {
        std::__cxx11::string::~string((string *)&fname);
      }
      in_name = in_name + 1;
    }
    std::__cxx11::string::~string((string *)&cwd);
  }
  return bVar5;
}

Assistant:

bool cmCTestSubdirCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  for (std::string const& arg : args) {
    std::string fname;

    if (cmSystemTools::FileIsFullPath(arg)) {
      fname = arg;
    } else {
      fname = cwd;
      fname += "/";
      fname += arg;
    }

    if (!cmSystemTools::FileIsDirectory(fname)) {
      // No subdirectory? So what...
      continue;
    }
    bool readit = false;
    {
      cmWorkingDirectory workdir(fname);
      if (workdir.Failed()) {
        this->SetError("Failed to change directory to " + fname + " : " +
                       std::strerror(workdir.GetLastResult()));
        return false;
      }
      const char* testFilename;
      if (cmSystemTools::FileExists("CTestTestfile.cmake")) {
        // does the CTestTestfile.cmake exist ?
        testFilename = "CTestTestfile.cmake";
      } else if (cmSystemTools::FileExists("DartTestfile.txt")) {
        // does the DartTestfile.txt exist ?
        testFilename = "DartTestfile.txt";
      } else {
        // No CTestTestfile? Who cares...
        continue;
      }
      fname += "/";
      fname += testFilename;
      readit = this->Makefile->ReadDependentFile(fname);
    }
    if (!readit) {
      std::string m = "Could not find include file: ";
      m += fname;
      this->SetError(m);
      return false;
    }
  }
  return true;
}